

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O3

TonkResult
tonk_advertise(TonkSocket tonkSocket,char *ipString,uint16_t port,void *data,uint32_t bytes)

{
  undefined6 in_register_00000012;
  TonkResult TVar1;
  Result result;
  Result local_10;
  
  TVar1 = Tonk_InvalidInput;
  if ((int)CONCAT62(in_register_00000012,port) != 0 &&
      (ipString != (char *)0x0 && tonkSocket != (TonkSocket)0x0)) {
    if ((bytes < 0x501) && (data != (void *)0x0 || bytes == 0)) {
      tonk::ApplicationSession::tonk_advertise
                ((ApplicationSession *)&stack0xfffffffffffffff0,(char *)tonkSocket,
                 (uint16_t)ipString,(void *)(ulong)port,(uint32_t)data);
      if (local_10.Error == (ErrorResult *)0x0) {
        TVar1 = Tonk_Success;
      }
      else {
        switch((local_10.Error)->Type) {
        case Tonk:
          TVar1 = (TonkResult)(local_10.Error)->Code;
          break;
        case Siamese:
          TVar1 = Tonk_FECFailed;
          break;
        case Asio:
        case LastErr:
          TVar1 = Tonk_NetworkFailed;
          break;
        case Cymric:
          TVar1 = Tonk_PRNGFailed;
          break;
        default:
          TVar1 = Tonk_Error;
        }
      }
      tonk::Result::~Result(&stack0xfffffffffffffff0);
    }
  }
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_advertise(
    TonkSocket tonkSocket, ///< [in] Socket to send advertisement from
    const char*  ipString, ///< [in] Destination IP address
    uint16_t         port, ///< [in] Destination port
    const void*      data, ///< [in] Message data
    uint32_t        bytes  ///< [in] Message bytes
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (!session || !ipString || port == 0 ||
        (data == nullptr && bytes > 0) ||
        bytes > TONK_MAX_UNRELIABLE_BYTES)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = session->tonk_advertise(ipString, port, data, bytes);
    return TonkResultFromDetailedResult(result);
}